

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O1

void ihevc_itrans_4x4(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                     WORD32 i4_shift,WORD32 zero_cols)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  bVar1 = (byte)i4_shift;
  iVar5 = 1 << (bVar1 - 1 & 0x1f);
  lVar3 = 0;
  do {
    if ((zero_cols & 1U) == 0) {
      iVar6 = pi2_src[src_strd * 3 + lVar3] * 0x24 + pi2_src[src_strd + lVar3] * 0x53;
      iVar2 = pi2_src[src_strd * 2 + lVar3] * 0x40 + pi2_src[lVar3] * 0x40;
      iVar4 = iVar6 + iVar5 + iVar2 >> (bVar1 & 0x1f);
      if (iVar4 < -0x7fff) {
        iVar4 = -0x8000;
      }
      if (0x7ffe < iVar4) {
        iVar4 = 0x7fff;
      }
      iVar8 = pi2_src[src_strd * 3 + lVar3] * -0x53 + pi2_src[src_strd + lVar3] * 0x24;
      iVar7 = pi2_src[src_strd * 2 + lVar3] * -0x40 + pi2_src[lVar3] * 0x40;
      *pi2_dst = (WORD16)iVar4;
      iVar4 = iVar8 + iVar5 + iVar7 >> (bVar1 & 0x1f);
      if (iVar4 < -0x7fff) {
        iVar4 = -0x8000;
      }
      if (0x7ffe < iVar4) {
        iVar4 = 0x7fff;
      }
      pi2_dst[1] = (WORD16)iVar4;
      iVar4 = (iVar5 - iVar8) + iVar7 >> (bVar1 & 0x1f);
      if (iVar4 < -0x7fff) {
        iVar4 = -0x8000;
      }
      if (0x7ffe < iVar4) {
        iVar4 = 0x7fff;
      }
      pi2_dst[2] = (WORD16)iVar4;
      iVar2 = (iVar5 - iVar6) + iVar2 >> (bVar1 & 0x1f);
      if (iVar2 < -0x7fff) {
        iVar2 = -0x8000;
      }
      if (0x7ffe < iVar2) {
        iVar2 = 0x7fff;
      }
      pi2_dst[3] = (WORD16)iVar2;
    }
    else {
      pi2_dst[0] = 0;
      pi2_dst[1] = 0;
      pi2_dst[2] = 0;
      pi2_dst[3] = 0;
    }
    zero_cols = zero_cols >> 1;
    lVar3 = lVar3 + 1;
    pi2_dst = pi2_dst + dst_strd;
  } while ((int)lVar3 != 4);
  return;
}

Assistant:

void ihevc_itrans_4x4(WORD16 *pi2_src,
                      WORD16 *pi2_dst,
                      WORD32 src_strd,
                      WORD32 dst_strd,
                      WORD32 i4_shift,
                      WORD32 zero_cols)
{
    WORD32 j;
    WORD32 e[2], o[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_4; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_4 * sizeof(WORD16));
        }
        else
        {

            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            o[0] = g_ai2_ihevc_trans_4[1][0] * pi2_src[src_strd]
                            + g_ai2_ihevc_trans_4[3][0] * pi2_src[3 * src_strd];
            o[1] = g_ai2_ihevc_trans_4[1][1] * pi2_src[src_strd]
                            + g_ai2_ihevc_trans_4[3][1] * pi2_src[3 * src_strd];
            e[0] = g_ai2_ihevc_trans_4[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_4[2][0] * pi2_src[2 * src_strd];
            e[1] = g_ai2_ihevc_trans_4[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_4[2][1] * pi2_src[2 * src_strd];

            pi2_dst[0] =
                            CLIP_S16(((e[0] + o[0] + add) >> i4_shift));
            pi2_dst[1] =
                            CLIP_S16(((e[1] + o[1] + add) >> i4_shift));
            pi2_dst[2] =
                            CLIP_S16(((e[1] - o[1] + add) >> i4_shift));
            pi2_dst[3] =
                            CLIP_S16(((e[0] - o[0] + add) >> i4_shift));

        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}